

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall
rsg::FloatLiteral::FloatLiteral
          (FloatLiteral *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  pointer pSVar1;
  bool bVar2;
  int iVar3;
  VariableType *type;
  int ndx;
  long lVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ConstStridedValueAccess<1> CVar9;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  int local_50;
  VariableType *local_48;
  pointer pMStack_40;
  pointer local_38;
  pointer pMStack_30;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__FloatLiteral_0072c8e0;
  type = VariableType::getScalarType(TYPE_FLOAT);
  ValueStorage<64>::ValueStorage(&this->m_value,type);
  local_78._8_8_ = &local_60;
  local_78._0_8_ = (VariableType *)0x1;
  local_78._16_8_ = 0;
  local_60._M_local_buf[0] = '\0';
  local_50 = 1;
  local_48 = (VariableType *)0x0;
  pMStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  pMStack_30 = (pointer)0x0;
  bVar2 = VariableType::operator==(valueRange.m_type,(VariableType *)local_78);
  VariableType::~VariableType((VariableType *)local_78);
  fVar6 = 10.0;
  if (bVar2) {
    local_78._0_8_ = valueRange.m_type;
    local_78._8_8_ = valueRange.m_min;
    CVar9 = ConstStridedValueAccess<1>::component((ConstStridedValueAccess<1> *)local_78,0);
    fVar8 = (CVar9.m_value)->floatVal;
    local_78._0_8_ = valueRange.m_type;
    local_78._8_8_ = valueRange.m_max;
    CVar9 = ConstStridedValueAccess<1>::component((ConstStridedValueAccess<1> *)local_78,0);
    uVar5 = -(uint)(fVar8 <= -INFINITY);
    fVar6 = (CVar9.m_value)->floatVal;
    fVar8 = (float)(~uVar5 & (uint)fVar8 | uVar5 & 0xc1200000);
    if (INFINITY <= fVar6) {
      fVar6 = 10.0;
    }
  }
  else {
    fVar8 = -10.0;
  }
  iVar3 = de::Random::getInt(state->m_random,0,(int)((fVar6 - fVar8) * 4.0) + 1);
  VariableType::getScalarType(TYPE_FLOAT);
  fVar7 = (float)iVar3 * 0.25 + fVar8;
  pSVar1 = (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
    pSVar1[lVar4].intVal =
         ~-(uint)(fVar8 < fVar7) & (uint)fVar8 |
         (-(uint)(fVar6 <= fVar7) & (uint)fVar6 | ~-(uint)(fVar6 <= fVar7) & (uint)fVar7) &
         -(uint)(fVar8 < fVar7);
  }
  return;
}

Assistant:

FloatLiteral::FloatLiteral (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_value(VariableType::getScalarType(VariableType::TYPE_FLOAT))
{
	float minVal	= -10.0f;
	float maxVal	= +10.0f;
	float step		= 0.25f;

	if (valueRange.getType() == VariableType(VariableType::TYPE_FLOAT, 1))
	{
		minVal = valueRange.getMin().component(0).asFloat();
		maxVal = valueRange.getMax().component(0).asFloat();

		if (Scalar::min<float>() == minVal)
			minVal = -10.0f;

		if (Scalar::max<float>() == maxVal)
			maxVal = +10.0f;
	}

	int numSteps = (int)((maxVal-minVal)/step) + 1;

	const float		value	= deFloatClamp(minVal + step*(float)state.getRandom().getInt(0, numSteps), minVal, maxVal);
	ExecValueAccess	access	= m_value.getValue(VariableType::getScalarType(VariableType::TYPE_FLOAT));

	for (int ndx = 0; ndx < EXEC_VEC_WIDTH; ndx++)
		access.asFloat(ndx) = value;
}